

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O2

Scalar<int> * __thiscall iqxmlrpc::Value::cast<iqxmlrpc::Scalar<int>>(Value *this)

{
  Scalar<int> *pSVar1;
  Bad_cast *this_00;
  
  if (this->value != (Value_type *)0x0) {
    pSVar1 = (Scalar<int> *)
             __dynamic_cast(this->value,&Value_type::typeinfo,&Scalar<int>::typeinfo,0);
    if (pSVar1 != (Scalar<int> *)0x0) {
      return pSVar1;
    }
  }
  this_00 = (Bad_cast *)__cxa_allocate_exception(0x18);
  Bad_cast::Bad_cast(this_00);
  __cxa_throw(this_00,&Bad_cast::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T* Value::cast() const
{
  T* t = dynamic_cast<T*>( value );
  if( !t )
    throw Bad_cast();
  return t;
}